

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mplayer.c
# Opt level: O3

monst * mk_mplayer(permonst *ptr,level *lev,xchar x,xchar y,boolean special)

{
  xchar xVar1;
  xchar xVar2;
  permonst *ptr_00;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  monst *pmVar7;
  size_t sVar8;
  obj *poVar9;
  short sVar10;
  short sVar11;
  int iVar12;
  char *pcVar13;
  monst *pmVar14;
  int tmp;
  bool bVar15;
  bool bVar16;
  char nam [32];
  short local_8c;
  short local_84;
  short local_80;
  short local_7c;
  short local_6c;
  int local_58;
  short local_54 [14];
  permonst *local_38;
  
  if (mons + 0x168 < ptr || ptr < mons + 0x159) {
    return (monst *)0x0;
  }
  pmVar7 = lev->monsters[x][y];
  if ((pmVar7 != (monst *)0x0) && ((pmVar7->field_0x61 & 2) == 0)) {
    rloc(lev,pmVar7,'\0');
  }
  xVar2 = dungeon_topology.d_astral_level.dnum;
  xVar1 = u.uz.dnum;
  local_38 = ptr;
  pmVar7 = makemon(ptr,lev,(int)x,(int)y,0);
  if (pmVar7 == (monst *)0x0) {
    return (monst *)0x0;
  }
  uVar4 = mt_random();
  local_8c = 0x26;
  if ((uVar4 & 1) == 0) {
    iVar5 = rnd_class(10,0x41);
    local_8c = (short)iVar5;
  }
  iVar5 = rnd_class(0x54,0x5d);
  local_80 = (short)iVar5;
  uVar4 = mt_random();
  if ((uVar4 & 7) == 0) {
    local_7c = 0;
  }
  else {
    iVar5 = rnd_class(0x80,0x87);
    local_7c = (short)iVar5;
  }
  uVar4 = mt_random();
  if ((uVar4 & 7) == 0) {
    local_6c = 0;
  }
  else {
    iVar5 = rnd_class(0x48,0x53);
    local_6c = (short)iVar5;
  }
  uVar4 = mt_random();
  if ((uVar4 & 7) == 0) {
    local_84 = 0;
  }
  else {
    iVar5 = rnd_class(0x89,0x8e);
    local_84 = (short)iVar5;
  }
  bVar15 = xVar1 == xVar2;
  bVar16 = special != '\0';
  uVar4 = mt_random();
  iVar5 = (uVar4 & 0xf) + 1;
  if (bVar16 && bVar15) {
    iVar5 = (uVar4 & 0xf) + 0xf;
  }
  pmVar7->m_lev = (uchar)iVar5;
  iVar12 = iVar5;
  do {
    uVar4 = mt_random();
    iVar5 = iVar5 + uVar4 % 10;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (bVar16 && bVar15) {
    uVar4 = mt_random();
    iVar5 = uVar4 / 0x1e + uVar4 / 0x1e + (uVar4 / 0x1e) * -0x20 + uVar4 + iVar5 + 0x1f;
    pmVar7->mhpmax = iVar5;
    pmVar7->mhp = iVar5;
    uVar4 = pmVar7->data->mflags2;
    iVar5 = 0;
LAB_001f3b57:
    uVar6 = mt_random();
    pmVar14 = level->monlist;
    do {
      if (pmVar14 == (monst *)0x0) {
        pcVar13 = developers[uVar6 % 0x35];
        if ((uVar4 >> 0x11 & 1) == 0) {
          strcpy((char *)&local_58,pcVar13);
          goto LAB_001f3c60;
        }
        iVar5 = strcmp(pcVar13,"Janet");
        if (iVar5 != 0) {
          uVar4 = mt_random();
          pcVar13 = "Maud";
          if ((uVar4 & 1) == 0) {
            pcVar13 = "Eve";
          }
        }
        strcpy((char *)&local_58,pcVar13);
        goto LAB_001f3cbe;
      }
      if (pmVar14->data < (permonst *)((long)&mons[0x168].mname + 1) &&
          &mons[0x158].field_0x3f < pmVar14->data) {
        pcVar13 = developers[uVar6 % 0x35];
        sVar10 = pmVar14->mxlth;
        sVar8 = strlen(pcVar13);
        iVar12 = strncmp(pcVar13,(char *)((long)(pmVar14->mtrack + 0x18) + (long)sVar10),sVar8);
        if (iVar12 == 0) goto LAB_001f3be3;
      }
      pmVar14 = pmVar14->nmon;
    } while( true );
  }
  pmVar7->mhpmax = iVar5 + 0x1e;
  pmVar7->mhp = iVar5 + 0x1e;
LAB_001f3d21:
  pmVar7->field_0x62 = pmVar7->field_0x62 & 0xbf;
  set_malign(pmVar7);
  ptr_00 = local_38;
  iVar5 = monsndx(local_38);
  switch(iVar5) {
  case 0x159:
    uVar4 = mt_random();
    sVar11 = 0x41;
    goto LAB_001f3fd5;
  case 0x15a:
    uVar4 = mt_random();
    if ((uVar4 & 1) != 0) {
      uVar4 = mt_random();
      local_8c = 0x27;
      if ((uVar4 & 1) == 0) {
        local_8c = 0x1c;
      }
      local_84 = 0;
    }
    uVar4 = mt_random();
    if ((uVar4 & 1) != 0) {
      iVar5 = rnd_class(0x6a,0x71);
      local_80 = (short)iVar5;
    }
    if (local_6c == 0x51) {
      local_6c = 0;
    }
    goto switchD_001f3d64_caseD_15d;
  case 0x15b:
  case 0x15c:
    uVar4 = mt_random();
    sVar10 = 0x39;
    if ((uVar4 & 3) == 0) {
      uVar4 = mt_random();
      sVar10 = 0x3c;
      if ((uVar4 & 1) == 0) {
        sVar10 = local_8c;
      }
    }
    if (local_6c == 0x51) {
      local_6c = 0;
    }
    break;
  case 0x15d:
  case 0x166:
    goto switchD_001f3d64_caseD_15d;
  case 0x15e:
    uVar4 = mt_random();
    sVar10 = 0x3e;
    if (((uVar4 & 3) == 0) && (uVar4 = mt_random(), sVar10 = local_8c, (uVar4 & 1) != 0)) {
      uVar4 = mt_random();
      sVar10 = 0x10a;
      if ((uVar4 & 1) == 0) {
        sVar10 = 0x16;
      }
    }
    uVar4 = mt_random();
    if ((uVar4 & 3) != 0) {
      uVar4 = mt_random();
      local_6c = (ushort)((uVar4 & 1) == 0) * 2 + 0x51;
    }
    uVar4 = mt_random();
    if ((uVar4 & 1) != 0) {
      local_84 = 0;
    }
    break;
  case 0x15f:
    uVar4 = mt_random();
    uVar4 = uVar4 & 3;
    sVar10 = 0x26;
    goto LAB_001f3ebd;
  case 0x160:
    uVar4 = mt_random();
    local_80 = 0;
    if ((uVar4 & 1) != 0) {
      local_84 = 0;
    }
    local_7c = 0x81;
    goto LAB_001f40b0;
  case 0x161:
  case 0x162:
    uVar4 = mt_random();
    sVar10 = 0x39;
    if ((uVar4 & 1) == 0) {
      sVar10 = local_8c;
    }
    uVar4 = mt_random();
    if ((uVar4 & 1) != 0) {
      iVar5 = rnd_class(0x6a,0x71);
      local_80 = (short)iVar5;
    }
    uVar4 = mt_random();
    sVar11 = 0x81;
    if ((uVar4 & 3) == 0) {
      sVar11 = local_7c;
    }
    local_7c = sVar11;
    uVar4 = mt_random();
    if ((uVar4 & 3) != 0) {
      uVar4 = mt_random();
      local_6c = (ushort)((uVar4 & 1) == 0) * 2 + 0x51;
    }
    uVar4 = mt_random();
    if ((uVar4 & 1) != 0) {
      local_84 = 0;
    }
    break;
  case 0x163:
    uVar4 = mt_random();
    sVar11 = 0x12;
    goto LAB_001f3fd5;
  case 0x164:
    uVar4 = mt_random();
    sVar11 = 0x1d;
    goto LAB_001f3fd5;
  case 0x165:
    uVar4 = mt_random();
    sVar11 = 0x28;
LAB_001f3fd5:
    sVar10 = local_8c;
    if ((uVar4 & 1) == 0) break;
    goto LAB_001f3fe8;
  case 0x167:
    uVar4 = mt_random();
    uVar4 = uVar4 & 1;
    sVar10 = 0x3b;
LAB_001f3ebd:
    if (uVar4 == 0) {
      sVar10 = local_8c;
    }
    uVar4 = mt_random();
    if ((uVar4 & 1) != 0) {
      iVar5 = rnd_class(0x6a,0x71);
      local_80 = (short)iVar5;
    }
    break;
  case 0x168:
    uVar4 = mt_random();
    if ((uVar4 & 3) != 0) {
      uVar4 = mt_random();
      local_8c = 0x3e;
      if ((uVar4 & 1) == 0) {
        local_8c = 0x15;
      }
    }
    uVar4 = mt_random();
    if ((uVar4 & 1) != 0) {
      uVar4 = mt_random();
      local_80 = ((ushort)uVar4 & 1) * 4 + 0x55;
      local_7c = 0x86;
    }
    uVar4 = mt_random();
    sVar10 = 0x51;
    if ((uVar4 & 3) == 0) {
      sVar10 = local_6c;
    }
    local_6c = sVar10;
    local_84 = 0;
    goto switchD_001f3d64_caseD_15d;
  default:
    monsndx(ptr_00);
    warning("bad mplayer monster: %d");
    goto LAB_001f40b0;
  }
LAB_001f3fdd:
  sVar11 = sVar10;
  if (sVar11 == 0) goto LAB_001f40b0;
LAB_001f3fe8:
  poVar9 = mksobj(lev,(int)sVar11,'\x01','\0');
  uVar4 = mt_random();
  if (bVar16 && bVar15) {
    bVar3 = (byte)uVar4 + (char)(uVar4 / 5) * -5 + 4;
  }
  else {
    bVar3 = (byte)uVar4 & 3;
  }
  poVar9->spe = bVar3;
  uVar4 = mt_random();
  if (uVar4 * -0x55555555 < 0x55555556) {
    uVar4 = 0x1000;
LAB_001f4054:
    *(uint *)&poVar9->field_0x4a = *(uint *)&poVar9->field_0x4a | uVar4;
  }
  else {
    uVar6 = mt_random();
    uVar4 = 0x100000;
    if ((uVar6 & 1) == 0) goto LAB_001f4054;
  }
  if (bVar16 && bVar15) {
    uVar4 = mt_random();
    if (uVar4 * -0x33333333 < 0x33333334) {
      poVar9 = mk_artifact(lev,poVar9,-0x80);
    }
    else {
      poVar9 = create_oprop(lev,poVar9,'\0');
    }
  }
  if (poVar9->oartifact == '\n') {
    uVar4 = mt_random();
    poVar9->spe = ((byte)uVar4 & 3) + 1;
  }
  mpickobj(pmVar7,poVar9);
LAB_001f40b0:
  if (bVar16 && bVar15) {
    uVar4 = mt_random();
    if ((uVar4 * -0x33333333 >> 1 | (uint)((uVar4 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a) {
      uVar4 = mt_random();
      mongets(pmVar7,(uVar4 * -0x55555555 < 0x55555556) + 0x20f);
    }
    mk_mplayer_armor(pmVar7,local_80);
    mk_mplayer_armor(pmVar7,local_7c);
    mk_mplayer_armor(pmVar7,local_6c);
    mk_mplayer_armor(pmVar7,local_84);
    uVar4 = mt_random();
    if ((uVar4 & 7) != 0) {
      iVar5 = rnd_class(0x8f,0x92);
      mk_mplayer_armor(pmVar7,(short)iVar5);
    }
    uVar4 = mt_random();
    if ((uVar4 & 7) != 0) {
      iVar5 = rnd_class(0x93,0x9c);
      mk_mplayer_armor(pmVar7,(short)iVar5);
    }
    m_dowear(lev,pmVar7,'\x01');
    uVar6 = mt_random();
    uVar4 = mt_random();
    if (uVar6 * -0x55555555 < 0x55555556) {
      uVar4 = uVar4 & 0xf;
    }
    else {
      uVar4 = uVar4 % 3;
    }
    for (; uVar4 != 0; uVar4 = uVar4 - 1) {
      iVar5 = rnd_class(0x1f0,0x205);
      mongets(pmVar7,iVar5);
    }
    uVar4 = mt_random();
    mkmonmoney(pmVar7,(ulong)(uVar4 % 1000));
    uVar4 = mt_random();
    for (uVar4 = uVar4 % 10; uVar4 != 0; uVar4 = uVar4 - 1) {
      poVar9 = mkobj(lev,'\0','\0');
      mpickobj(pmVar7,poVar9);
    }
  }
  uVar4 = mt_random();
  iVar5 = uVar4 % 3 + 1;
  do {
    iVar12 = rnd_offensive_item(pmVar7);
    mongets(pmVar7,iVar12);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  uVar4 = mt_random();
  iVar5 = uVar4 % 3 + 1;
  do {
    iVar12 = rnd_defensive_item(pmVar7);
    mongets(pmVar7,iVar12);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  uVar4 = mt_random();
  iVar5 = uVar4 % 3 + 1;
  do {
    iVar12 = rnd_misc_item(pmVar7);
    mongets(pmVar7,iVar12);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return pmVar7;
LAB_001f3be3:
  iVar5 = iVar5 + 1;
  if (iVar5 == 100) goto code_r0x001f3bf9;
  goto LAB_001f3b57;
code_r0x001f3bf9:
  pcVar13 = "Eve";
  if ((uVar4 & 0x20000) == 0) {
    pcVar13 = "Adam";
  }
  strcpy((char *)&local_58,pcVar13);
  if ((uVar4 & 0x20000) == 0) {
LAB_001f3c60:
    if (local_54[0] == 0x74 && local_58 == 0x656e614a) goto LAB_001f3cbe;
    pmVar7->field_0x60 = pmVar7->field_0x60 & 0xfe;
  }
  else {
LAB_001f3cbe:
    pmVar7->field_0x60 = pmVar7->field_0x60 | 1;
  }
  sVar8 = strlen((char *)&local_58);
  *(undefined4 *)((long)local_54 + (sVar8 - 4)) = 0x65687420;
  *(undefined2 *)((long)local_54 + sVar8) = 0x20;
  bVar3 = pmVar7->m_lev;
  iVar5 = monsndx(pmVar7->data);
  pcVar13 = rank_of((uint)bVar3,(short)iVar5,(byte)*(undefined4 *)&pmVar7->field_0x60 & 1);
  strcat((char *)&local_58,pcVar13);
  pmVar7 = christen_monst(pmVar7,(char *)&local_58);
  mongets(pmVar7,0xd8);
  goto LAB_001f3d21;
switchD_001f3d64_caseD_15d:
  sVar10 = local_8c;
  goto LAB_001f3fdd;
}

Assistant:

struct monst *mk_mplayer(const struct permonst *ptr,
			 struct level *lev, xchar x, xchar y, boolean special)
{
	struct monst *mtmp;
	char nam[PL_NSIZ];

	if (!is_mplayer(ptr))
		return NULL;

	if (MON_AT(lev, x, y))
		rloc(lev, m_at(lev, x, y), FALSE); /* insurance */

	if (!In_endgame(&u.uz)) special = FALSE;

	if ((mtmp = makemon(ptr, lev, x, y, NO_MM_FLAGS)) != 0) {
	    short weapon = rn2(2) ? LONG_SWORD : rnd_class(SPEAR, BULLWHIP);
	    short armor = rnd_class(GRAY_DRAGON_SCALE_MAIL, YELLOW_DRAGON_SCALE_MAIL);
	    short cloak = !rn2(8) ? STRANGE_OBJECT :
	    		rnd_class(OILSKIN_CLOAK, CLOAK_OF_DISPLACEMENT);
	    short helm = !rn2(8) ? STRANGE_OBJECT :
	    		rnd_class(ELVEN_LEATHER_HELM, HELM_OF_TELEPATHY);
	    short shield = !rn2(8) ? STRANGE_OBJECT :
	    		rnd_class(ELVEN_SHIELD, SHIELD_OF_REFLECTION);
	    int quan;
	    struct obj *otmp;

	    mtmp->m_lev = (special ? rn1(16,15) : rnd(16));
	    mtmp->mhp = mtmp->mhpmax = dice((int)mtmp->m_lev,10) +
					(special ? (30 + rnd(30)) : 30);
	    if (special) {
	        get_mplname(mtmp, nam);
	        mtmp = christen_monst(mtmp, nam);
		/* that's why they are "stuck" in the endgame :-) */
		mongets(mtmp, FAKE_AMULET_OF_YENDOR);
	    }
	    mtmp->mpeaceful = 0;
	    set_malign(mtmp); /* peaceful may have changed again */

	    switch (monsndx(ptr)) {
		case PM_ARCHEOLOGIST:
		    if (rn2(2)) weapon = BULLWHIP;
		    break;
		case PM_BARBARIAN:
		    if (rn2(2)) {
		    	weapon = rn2(2) ? TWO_HANDED_SWORD : BATTLE_AXE;
		    	shield = STRANGE_OBJECT;
		    }
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    if (helm == HELM_OF_BRILLIANCE) helm = STRANGE_OBJECT;
		    break;
		case PM_CAVEMAN:
		case PM_CAVEWOMAN:
		    if (rn2(4)) weapon = MACE;
		    else if (rn2(2)) weapon = CLUB;
		    if (helm == HELM_OF_BRILLIANCE) helm = STRANGE_OBJECT;
		    break;
		case PM_CONVICT:
		    /* Defaults are just fine. */
		    break;
		case PM_HEALER:
		    if (rn2(4)) weapon = QUARTERSTAFF;
		    else if (rn2(2)) weapon = rn2(2) ? UNICORN_HORN : SCALPEL;
		    if (rn2(4)) helm = rn2(2) ? HELM_OF_BRILLIANCE : HELM_OF_TELEPATHY;
		    if (rn2(2)) shield = STRANGE_OBJECT;
		    break;
		case PM_KNIGHT:
		    if (rn2(4)) weapon = LONG_SWORD;
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    break;
		case PM_MONK:
		    weapon = STRANGE_OBJECT;
		    armor = STRANGE_OBJECT;
		    cloak = ROBE;
		    if (rn2(2)) shield = STRANGE_OBJECT;
		    break;
		case PM_PRIEST:
		case PM_PRIESTESS:
		    if (rn2(2)) weapon = MACE;
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    if (rn2(4)) cloak = ROBE;
		    if (rn2(4)) helm = rn2(2) ? HELM_OF_BRILLIANCE : HELM_OF_TELEPATHY;
		    if (rn2(2)) shield = STRANGE_OBJECT;
		    break;
		case PM_RANGER:
		    if (rn2(2)) weapon = ELVEN_DAGGER;
		    break;
		case PM_ROGUE:
		    if (rn2(2)) weapon = SHORT_SWORD;
		    break;
		case PM_SAMURAI:
		    if (rn2(2)) weapon = KATANA;
		    break;
		case PM_TOURIST:
		    /* Defaults are just fine */
		    break;
		case PM_VALKYRIE:
		    if (rn2(2)) weapon = WAR_HAMMER;
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    break;
		case PM_WIZARD:
		    if (rn2(4)) weapon = rn2(2) ? QUARTERSTAFF : ATHAME;
		    if (rn2(2)) {
		    	armor = rn2(2) ? BLACK_DRAGON_SCALE_MAIL :
		    			SILVER_DRAGON_SCALE_MAIL;
		    	cloak = CLOAK_OF_MAGIC_RESISTANCE;
		    }
		    if (rn2(4)) helm = HELM_OF_BRILLIANCE;
		    shield = STRANGE_OBJECT;
		    break;
		default:
		    warning("bad mplayer monster: %d", monsndx(ptr));
		    weapon = 0;
		    break;
	    }

	    if (weapon != STRANGE_OBJECT) {
		otmp = mksobj(lev, weapon, TRUE, FALSE);
		otmp->spe = (special ? rn1(5,4) : rn2(4));
		if (!rn2(3)) otmp->oerodeproof = 1;
		else if (!rn2(2)) otmp->greased = 1;
		if (special) {
		    if (!rn2(5))
			otmp = mk_artifact(lev, otmp, A_NONE);
		    else
			otmp = create_oprop(lev, otmp, FALSE);
		}
		/* mplayers knew better than to overenchant Magicbane */
		if (otmp->oartifact == ART_MAGICBANE)
		    otmp->spe = rnd(4);
		mpickobj(mtmp, otmp);
	    }

	    if (special) {
		if (!rn2(10))
		    mongets(mtmp, rn2(3) ? LUCKSTONE : LOADSTONE);
		mk_mplayer_armor(mtmp, armor);
		mk_mplayer_armor(mtmp, cloak);
		mk_mplayer_armor(mtmp, helm);
		mk_mplayer_armor(mtmp, shield);
		if (rn2(8))
		    mk_mplayer_armor(mtmp, rnd_class(LEATHER_GLOVES,
					       GAUNTLETS_OF_DEXTERITY));
		if (rn2(8))
		    mk_mplayer_armor(mtmp, rnd_class(LOW_BOOTS, LEVITATION_BOOTS));
		m_dowear(lev, mtmp, TRUE);

		quan = rn2(3) ? rn2(3) : rn2(16);
		while (quan--)
		    mongets(mtmp, rnd_class(DILITHIUM_CRYSTAL, JADE));
		/* To get the gold "right" would mean a player can double his */
		/* gold supply by killing one mplayer.  Not good. */
		mkmonmoney(mtmp, rn2(1000));
		quan = rn2(10);
		while (quan--)
		    mpickobj(mtmp, mkobj(lev, RANDOM_CLASS, FALSE));
	    }
	    quan = rnd(3);
	    while (quan--)
		mongets(mtmp, rnd_offensive_item(mtmp));
	    quan = rnd(3);
	    while (quan--)
		mongets(mtmp, rnd_defensive_item(mtmp));
	    quan = rnd(3);
	    while (quan--)
		mongets(mtmp, rnd_misc_item(mtmp));
	}

	return mtmp;
}